

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency_transform.cc
# Opt level: O0

void __thiscall
sptk::FrequencyTransform::FrequencyTransform
          (FrequencyTransform *this,int num_input_order,int num_output_order,double alpha)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  *in_RDI = &PTR__FrequencyTransform_0012ad28;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  in_RDI[2] = in_XMM0_Qa;
  *(undefined1 *)(in_RDI + 3) = 1;
  if (((-1 < *(int *)(in_RDI + 1)) && (-1 < *(int *)((long)in_RDI + 0xc))) &&
     (bVar1 = IsValidAlpha((double)in_RDI[2]), bVar1)) {
    return;
  }
  *(undefined1 *)(in_RDI + 3) = 0;
  return;
}

Assistant:

FrequencyTransform::FrequencyTransform(int num_input_order,
                                       int num_output_order, double alpha)
    : num_input_order_(num_input_order),
      num_output_order_(num_output_order),
      alpha_(alpha),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_output_order_ < 0 ||
      !sptk::IsValidAlpha(alpha_)) {
    is_valid_ = false;
    return;
  }
}